

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::CreateSignatureHashRequest::CreateSignatureHashRequest
          (CreateSignatureHashRequest *this)

{
  allocator local_11;
  CreateSignatureHashRequest *local_10;
  CreateSignatureHashRequest *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::CreateSignatureHashRequest>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::CreateSignatureHashRequest>);
  (this->super_JsonClassBase<cfd::js::api::json::CreateSignatureHashRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__CreateSignatureHashRequest_01b3ce60;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->tx_,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  CreateSignatureHashTxInRequest::CreateSignatureHashTxInRequest(&this->txin_);
  CollectFieldName();
  return;
}

Assistant:

CreateSignatureHashRequest() {
    CollectFieldName();
  }